

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDictionaryTypeHandler.cpp
# Opt level: O0

SimpleDictionaryUnorderedTypeHandler<int,_const_Js::PropertyRecord_*,_false> * __thiscall
Js::SimpleDictionaryTypeHandlerBase<int,Js::JavascriptString*,false>::
ConvertToTypeHandler<Js::SimpleDictionaryUnorderedTypeHandler<int,Js::PropertyRecord_const*,false>,Js::PropertyRecord_const*>
          (SimpleDictionaryTypeHandlerBase<int,Js::JavascriptString*,false> *this,
          DynamicObject *instance)

{
  JavascriptString *key;
  code *pcVar1;
  SimpleDictionaryUnorderedTypeHandler<int,_const_Js::PropertyRecord_*,_false> *pSVar2;
  bool bVar3;
  bool bVar4;
  byte bVar5;
  BYTE BVar6;
  PropertyTypes values;
  uint16 inlineSlotCapacity;
  uint16 offsetOfInlineSlots;
  int iVar7;
  TypeId TVar8;
  Recycler *pRVar9;
  SimpleDictionaryUnorderedTypeHandler<int,_const_Js::PropertyRecord_*,_false> *this_00;
  undefined4 *puVar10;
  DynamicType *oldType_00;
  RecyclerWeakReference<Js::DynamicObject> *oldSingletonInstanceBefore;
  RecyclerWeakReference<Js::DynamicObject> **ppRVar11;
  ScriptContext *pSVar12;
  RecyclerWeakReference<Js::DynamicObject> *instance_00;
  DynamicType *pDVar13;
  BaseDictionary<Js::JavascriptString_*,_Js::SimpleDictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<Js::JavascriptString_*>::Entry,_JsUtil::NoResizeLock>
  *pBVar14;
  SimpleDictionaryPropertyDescriptor<int> *pSVar15;
  JavascriptString **ppJVar16;
  PropertyRecord *propertyKey_00;
  bool local_e9;
  bool local_e1;
  int local_a4;
  int i;
  JavascriptString *propertyKey;
  int iStack_90;
  SimpleDictionaryPropertyDescriptor<int> descriptor;
  bool transferUsedAsFixed;
  bool isOrMayBecomeShared;
  bool isTypeLocked;
  bool isGlobalObject;
  RecyclerWeakReference<Js::DynamicObject> *curSingletonInstance;
  bool canBeSingletonInstance;
  RecyclerWeakReference<Js::DynamicObject> *oldSingletonInstance;
  DynamicType *oldType;
  TrackAllocData local_58;
  SimpleDictionaryUnorderedTypeHandler<int,_const_Js::PropertyRecord_*,_false> *local_30;
  SimpleDictionaryUnorderedTypeHandler<int,_const_Js::PropertyRecord_*,_false> *newTypeHandler;
  Recycler *recycler;
  ScriptContext *scriptContext;
  DynamicObject *instance_local;
  SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_false> *this_local;
  
  scriptContext = (ScriptContext *)instance;
  instance_local = (DynamicObject *)this;
  recycler = (Recycler *)RecyclableObject::GetScriptContext(&instance->super_RecyclableObject);
  pRVar9 = ScriptContext::GetRecycler((ScriptContext *)recycler);
  newTypeHandler =
       (SimpleDictionaryUnorderedTypeHandler<int,_const_Js::PropertyRecord_*,_false> *)pRVar9;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_58,
             (type_info *)
             &SimpleDictionaryUnorderedTypeHandler<int,Js::PropertyRecord_const*,false>::typeinfo,0,
             0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
             ,0x1b2);
  pRVar9 = Memory::Recycler::TrackAllocInfo(pRVar9,&local_58);
  this_00 = (SimpleDictionaryUnorderedTypeHandler<int,_const_Js::PropertyRecord_*,_false> *)
            new<Memory::Recycler>(0x38,pRVar9,0x43c4b0);
  pSVar2 = newTypeHandler;
  iVar7 = DynamicTypeHandler::GetSlotCapacity((DynamicTypeHandler *)this);
  inlineSlotCapacity = DynamicTypeHandler::GetInlineSlotCapacity((DynamicTypeHandler *)this);
  offsetOfInlineSlots = DynamicTypeHandler::GetOffsetOfInlineSlots((DynamicTypeHandler *)this);
  SimpleDictionaryUnorderedTypeHandler<int,_const_Js::PropertyRecord_*,_false>::
  SimpleDictionaryUnorderedTypeHandler
            (this_00,(Recycler *)pSVar2,iVar7,inlineSlotCapacity,offsetOfInlineSlots);
  local_30 = this_00;
  bVar3 = DynamicTypeHandler::GetHasOnlyWritableDataProperties((DynamicTypeHandler *)this_00);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar10 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                ,0x1b4,"(newTypeHandler->GetHasOnlyWritableDataProperties())",
                                "newTypeHandler->GetHasOnlyWritableDataProperties()");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar10 = 0;
  }
  oldType_00 = DynamicObject::GetDynamicType((DynamicObject *)scriptContext);
  oldSingletonInstanceBefore =
       SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_false>::GetSingletonInstance
                 ((SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_false> *)this);
  SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_false>::
  TraceFixedFieldsBeforeTypeHandlerChange
            (L"SimpleDictionaryTypeHandler",L"[Simple]DictionaryTypeHandler",
             (DynamicObject *)scriptContext,(DynamicTypeHandler *)this,oldType_00,
             oldSingletonInstanceBefore);
  bVar3 = DynamicTypeHandler::CanBeSingletonInstance((DynamicObject *)scriptContext);
  if ((!bVar3) &&
     (bVar4 = SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_false>::
              HasSingletonInstance
                        ((SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_false> *)this
                        ), bVar4)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar10 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                ,0x1bf,"(canBeSingletonInstance || !this->HasSingletonInstance())",
                                "canBeSingletonInstance || !this->HasSingletonInstance()");
    if (!bVar4) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar10 = 0;
  }
  if (bVar3) {
    bVar3 = SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_false>::
            HasSingletonInstanceOnlyIfNeeded
                      ((SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_false> *)this);
    if (!bVar3) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar10 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                  ,0x1c4,"(HasSingletonInstanceOnlyIfNeeded())",
                                  "HasSingletonInstanceOnlyIfNeeded()");
      if (!bVar3) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar10 = 0;
    }
    bVar3 = DynamicTypeHandler::AreSingletonInstancesNeeded();
    if (bVar3) {
      ppRVar11 = Memory::WriteBarrierPtr::operator_cast_to_RecyclerWeakReference__
                           ((WriteBarrierPtr *)(this + 0x20));
      unique0x00012000 = *ppRVar11;
      if ((unique0x00012000 == (RecyclerWeakReference<Js::DynamicObject> *)0x0) ||
         (pSVar12 = (ScriptContext *)
                    Memory::RecyclerWeakReference<Js::DynamicObject>::Get(unique0x00012000),
         pSVar12 != scriptContext)) {
        pSVar2 = local_30;
        instance_00 = DynamicObject::CreateWeakReferenceToSelf((DynamicObject *)scriptContext);
        DynamicTypeHandler::SetSingletonInstance((DynamicTypeHandler *)pSVar2,instance_00);
      }
      else {
        DynamicTypeHandler::SetSingletonInstance
                  ((DynamicTypeHandler *)local_30,stack0xffffffffffffff78);
      }
    }
  }
  TVar8 = RecyclableObject::GetTypeId((RecyclableObject *)scriptContext);
  descriptor._3_1_ = TVar8 == TypeIds_GlobalObject;
  pDVar13 = DynamicObject::GetDynamicType((DynamicObject *)scriptContext);
  descriptor._2_1_ = DynamicType::GetIsLocked(pDVar13);
  descriptor.Attributes = DynamicTypeHandler::GetIsOrMayBecomeShared((DynamicTypeHandler *)this);
  if ((((bool)descriptor.Attributes) && (bVar3 = DynamicTypeHandler::IsolatePrototypes(), bVar3)) &&
     (bVar5 = DynamicTypeHandler::GetFlags((DynamicTypeHandler *)this), (bVar5 & 0x20) != 0)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar10 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                ,0x1d8,
                                "(!isOrMayBecomeShared || !IsolatePrototypes() || ((this->GetFlags() & IsPrototypeFlag) == 0))"
                                ,
                                "!isOrMayBecomeShared || !IsolatePrototypes() || ((this->GetFlags() & IsPrototypeFlag) == 0)"
                               );
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar10 = 0;
  }
  local_e1 = true;
  if (((descriptor._3_1_ & 1) == 0) && (local_e1 = true, (descriptor._2_1_ & 1) != 0)) {
    bVar5 = DynamicTypeHandler::GetFlags((DynamicTypeHandler *)this);
    local_e1 = true;
    if ((bVar5 & 0x20) == 0) {
      if ((descriptor.Attributes & 1) != 0) {
        bVar3 = DynamicTypeHandler::IsolatePrototypes();
        local_e1 = true;
        if (!bVar3) goto LAB_014d135a;
      }
      local_e1 = Phases::IsEnabled((Phases *)&DAT_01ea41a0,FixDataPropsPhase);
    }
  }
LAB_014d135a:
  descriptor._0_1_ = local_e1;
  SimpleDictionaryPropertyDescriptor<int>::SimpleDictionaryPropertyDescriptor
            ((SimpleDictionaryPropertyDescriptor<int> *)((long)&propertyKey + 4));
  local_a4 = 0;
  do {
    pBVar14 = Memory::
              WriteBarrierPtr<JsUtil::BaseDictionary<Js::JavascriptString_*,_Js::SimpleDictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<Js::JavascriptString_*>::Entry,_JsUtil::NoResizeLock>_>
              ::operator->((WriteBarrierPtr<JsUtil::BaseDictionary<Js::JavascriptString_*,_Js::SimpleDictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<Js::JavascriptString_*>::Entry,_JsUtil::NoResizeLock>_>
                            *)(this + 0x18));
    iVar7 = JsUtil::
            BaseDictionary<Js::JavascriptString_*,_Js::SimpleDictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<Js::JavascriptString_*>::Entry,_JsUtil::NoResizeLock>
            ::Count(pBVar14);
    if (iVar7 <= local_a4) {
      (local_30->super_SimpleDictionaryTypeHandlerBase<int,_const_Js::PropertyRecord_*,_false>).
      nextPropertyIndex = *(Type *)(this + 0x2c);
      SimpleDictionaryTypeHandlerBase<int,_const_Js::PropertyRecord_*,_false>::
      SetNumDeletedProperties
                (&local_30->
                  super_SimpleDictionaryTypeHandlerBase<int,_const_Js::PropertyRecord_*,_false>,
                 (byte)this[0x29]);
      SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_false>::ClearSingletonInstance
                ((SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_false> *)this);
      bVar5 = DynamicTypeHandler::GetFlags((DynamicTypeHandler *)local_30);
      if ((bVar5 & 0x20) != 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar10 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                    ,0x1fc,"((newTypeHandler->GetFlags() & IsPrototypeFlag) == 0)",
                                    "Why did we create a brand new type handler with a prototype flag set?"
                                   );
        if (!bVar3) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar10 = 0;
      }
      pSVar2 = local_30;
      BVar6 = DynamicTypeHandler::GetFlags((DynamicTypeHandler *)this);
      DynamicTypeHandler::SetFlags((DynamicTypeHandler *)pSVar2,' ',BVar6);
      pSVar2 = local_30;
      BVar6 = DynamicTypeHandler::GetFlags((DynamicTypeHandler *)this);
      DynamicTypeHandler::ChangeFlags((DynamicTypeHandler *)pSVar2,0xc1,BVar6);
      bVar3 = DynamicTypeHandler::GetIsInlineSlotCapacityLocked((DynamicTypeHandler *)local_30);
      if (!bVar3) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar10 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                    ,0x201,"(newTypeHandler->GetIsInlineSlotCapacityLocked())",
                                    "newTypeHandler->GetIsInlineSlotCapacityLocked()");
        if (!bVar3) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar10 = 0;
      }
      pSVar2 = local_30;
      values = DynamicTypeHandler::GetPropertyTypes((DynamicTypeHandler *)this);
      DynamicTypeHandler::SetPropertyTypes((DynamicTypeHandler *)pSVar2,0xb0,values);
      DynamicTypeHandler::SetInstanceTypeHandler
                ((DynamicTypeHandler *)local_30,(DynamicObject *)scriptContext,true);
      if (((descriptor._0_1_ & 1) == 0) &&
         ((pDVar13 = (DynamicType *)RecyclableObject::GetType((RecyclableObject *)scriptContext),
          pDVar13 == oldType_00 ||
          (TVar8 = Js::Type::GetTypeId(&oldType_00->super_Type), TVar8 == TypeIds_GlobalObject)))) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar10 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                    ,0x206,
                                    "(transferUsedAsFixed || (instance->GetType() != oldType && oldType->GetTypeId() != TypeIds_GlobalObject))"
                                    ,
                                    "transferUsedAsFixed || (instance->GetType() != oldType && oldType->GetTypeId() != TypeIds_GlobalObject)"
                                   );
        if (!bVar3) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar10 = 0;
      }
      bVar3 = SimpleDictionaryTypeHandlerBase<int,_const_Js::PropertyRecord_*,_false>::
              HasSingletonInstance
                        (&local_30->
                          super_SimpleDictionaryTypeHandlerBase<int,_const_Js::PropertyRecord_*,_false>
                        );
      if ((bVar3) && (bVar3 = DynamicObject::HasSharedType((DynamicObject *)scriptContext), bVar3))
      {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar10 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                    ,0x207,
                                    "(!newTypeHandler->HasSingletonInstance() || !instance->HasSharedType())"
                                    ,
                                    "!newTypeHandler->HasSingletonInstance() || !instance->HasSharedType()"
                                   );
        if (!bVar3) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar10 = 0;
      }
      SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_false>::
      TraceFixedFieldsAfterTypeHandlerChange
                ((DynamicObject *)scriptContext,(DynamicTypeHandler *)this,
                 (DynamicTypeHandler *)local_30,oldType_00,oldSingletonInstanceBefore);
      return local_30;
    }
    pBVar14 = Memory::
              WriteBarrierPtr<JsUtil::BaseDictionary<Js::JavascriptString_*,_Js::SimpleDictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<Js::JavascriptString_*>::Entry,_JsUtil::NoResizeLock>_>
              ::operator->((WriteBarrierPtr<JsUtil::BaseDictionary<Js::JavascriptString_*,_Js::SimpleDictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<Js::JavascriptString_*>::Entry,_JsUtil::NoResizeLock>_>
                            *)(this + 0x18));
    pSVar15 = JsUtil::
              BaseDictionary<Js::JavascriptString_*,_Js::SimpleDictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<Js::JavascriptString_*>::Entry,_JsUtil::NoResizeLock>
              ::GetValueAt(pBVar14,local_a4);
    unique0x00012000 = *pSVar15;
    pBVar14 = Memory::
              WriteBarrierPtr<JsUtil::BaseDictionary<Js::JavascriptString_*,_Js::SimpleDictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<Js::JavascriptString_*>::Entry,_JsUtil::NoResizeLock>_>
              ::operator->((WriteBarrierPtr<JsUtil::BaseDictionary<Js::JavascriptString_*,_Js::SimpleDictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<Js::JavascriptString_*>::Entry,_JsUtil::NoResizeLock>_>
                            *)(this + 0x18));
    ppJVar16 = JsUtil::
               BaseDictionary<Js::JavascriptString_*,_Js::SimpleDictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<Js::JavascriptString_*>::Entry,_JsUtil::NoResizeLock>
               ::GetKeyAt(pBVar14,local_a4);
    key = *ppJVar16;
    if ((local_30->super_SimpleDictionaryTypeHandlerBase<int,_const_Js::PropertyRecord_*,_false>).
        nextPropertyIndex < iStack_90) {
      (local_30->super_SimpleDictionaryTypeHandlerBase<int,_const_Js::PropertyRecord_*,_false>).
      nextPropertyIndex = iStack_90;
    }
    if ((local_30->super_SimpleDictionaryTypeHandlerBase<int,_const_Js::PropertyRecord_*,_false>).
        nextPropertyIndex != iStack_90) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar10 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                  ,0x1ec,
                                  "(newTypeHandler->nextPropertyIndex == descriptor.propertyIndex)",
                                  "newTypeHandler->nextPropertyIndex == descriptor.propertyIndex");
      if (!bVar3) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar10 = 0;
    }
    bVar3 = DynamicTypeHandler::GetIsShared((DynamicTypeHandler *)this);
    if ((bVar3) && ((propertyKey._4_1_ >> 2 & 1) != 0)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar10 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                  ,0x1ee,"(!GetIsShared() || !descriptor.isFixed)",
                                  "!GetIsShared() || !descriptor.isFixed");
      if (!bVar3) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar10 = 0;
    }
    pSVar2 = local_30;
    propertyKey_00 = TMapKey_ConvertKey<Js::PropertyRecord_const*>((ScriptContext *)recycler,key);
    local_e9 = false;
    if ((descriptor._0_1_ & 1) != 0) {
      local_e9 = (bool)(propertyKey._4_1_ >> 3 & 1);
    }
    SimpleDictionaryTypeHandlerBase<int,Js::PropertyRecord_const*,false>::
    Add<Js::PropertyRecord_const*>
              ((SimpleDictionaryTypeHandlerBase<int,Js::PropertyRecord_const*,false> *)pSVar2,
               propertyKey_00,propertyKey._5_1_,(bool)(propertyKey._4_1_ >> 1 & 1),
               (bool)(propertyKey._4_1_ >> 2 & 1),local_e9,(ScriptContext *)recycler);
    local_a4 = local_a4 + 1;
  } while( true );
}

Assistant:

U* SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::ConvertToTypeHandler(DynamicObject* instance)
    {
        ScriptContext* scriptContext = instance->GetScriptContext();
        Recycler* recycler = scriptContext->GetRecycler();

        U* newTypeHandler = RecyclerNew(recycler, U, recycler, GetSlotCapacity(), GetInlineSlotCapacity(), GetOffsetOfInlineSlots());
        // We expect the new type handler to start off marked as having only writable data properties.
        Assert(newTypeHandler->GetHasOnlyWritableDataProperties());

#if ENABLE_FIXED_FIELDS
#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
        DynamicType* oldType = instance->GetDynamicType();
        RecyclerWeakReference<DynamicObject>* oldSingletonInstance = GetSingletonInstance();
        TraceFixedFieldsBeforeTypeHandlerChange(_u("SimpleDictionaryTypeHandler"), _u("[Simple]DictionaryTypeHandler"), instance, this, oldType, oldSingletonInstance);
#endif

        bool const canBeSingletonInstance = DynamicTypeHandler::CanBeSingletonInstance(instance);
        // If this type had been installed on a stack instance it shouldn't have a singleton Instance
        Assert(canBeSingletonInstance || !this->HasSingletonInstance());

        if (canBeSingletonInstance)
        {
            // We assume the new type handler is not shared.  Hence it's ok to set this instance as the handler's singleton instance.
            Assert(HasSingletonInstanceOnlyIfNeeded());
            if (AreSingletonInstancesNeeded())
            {
                RecyclerWeakReference<DynamicObject>* curSingletonInstance = this->singletonInstance;
                if (curSingletonInstance != nullptr && curSingletonInstance->Get() == instance)
                {
                    newTypeHandler->SetSingletonInstance(curSingletonInstance);
                }
                else
                {
                    newTypeHandler->SetSingletonInstance(instance->CreateWeakReferenceToSelf());
                }
            }
        }

        // If we are a prototype or may become a prototype we must transfer used as fixed bits.
        // See point 4 in PathTypeHandlerBase::ConvertToSimpleDictionaryType.
        bool isGlobalObject = instance->GetTypeId() == TypeIds_GlobalObject;
        bool isTypeLocked = instance->GetDynamicType()->GetIsLocked();
        bool isOrMayBecomeShared = GetIsOrMayBecomeShared();
        Assert(!isOrMayBecomeShared || !IsolatePrototypes() || ((this->GetFlags() & IsPrototypeFlag) == 0));
        // For the global object we don't emit a type check before a hard-coded use of a fixed field. Therefore a type transition isn't sufficient to
        // invalidate any used fixed fields, and we must continue tracking them on the new type handler. If the type isn't locked, we may not change the
        // type of the instance, and we must also track the used fixed fields on the new handler.
        bool transferUsedAsFixed = isGlobalObject || !isTypeLocked || ((this->GetFlags() & IsPrototypeFlag) != 0 || (isOrMayBecomeShared && !IsolatePrototypes())) || PHASE_FORCE1(Js::FixDataPropsPhase);
#endif

        SimpleDictionaryPropertyDescriptor<TPropertyIndex> descriptor;
        TMapKey propertyKey;
        for (int i = 0; i < propertyMap->Count(); i++)
        {
            descriptor = propertyMap->GetValueAt(i);
            propertyKey = propertyMap->GetKeyAt(i);

            // newTH->nextPropertyIndex will be less than desc.propertyIndex, when we have function with same name parameters
            if (newTypeHandler->nextPropertyIndex < static_cast<typename U::PropertyIndexType>(descriptor.propertyIndex))
            {
                newTypeHandler->nextPropertyIndex = static_cast<typename U::PropertyIndexType>(descriptor.propertyIndex);
            }

            Assert(newTypeHandler->nextPropertyIndex == descriptor.propertyIndex);
#if ENABLE_FIXED_FIELDS
            Assert(!GetIsShared() || !descriptor.isFixed);
            newTypeHandler->Add(TMapKey_ConvertKey<UMapKey>(scriptContext, propertyKey), descriptor.Attributes, descriptor.isInitialized, descriptor.isFixed, transferUsedAsFixed && descriptor.usedAsFixed, scriptContext);
#else
            newTypeHandler->Add(TMapKey_ConvertKey<UMapKey>(scriptContext, propertyKey), descriptor.Attributes, true, false, false, scriptContext);
#endif
        }

        newTypeHandler->nextPropertyIndex = static_cast<typename U::PropertyIndexType>(nextPropertyIndex);
        newTypeHandler->SetNumDeletedProperties(numDeletedProperties);

#if ENABLE_FIXED_FIELDS
        ClearSingletonInstance();
#endif

        AssertMsg((newTypeHandler->GetFlags() & IsPrototypeFlag) == 0, "Why did we create a brand new type handler with a prototype flag set?");
        newTypeHandler->SetFlags(IsPrototypeFlag, this->GetFlags());
        newTypeHandler->ChangeFlags(IsExtensibleFlag | IsSealedOnceFlag | IsFrozenOnceFlag, this->GetFlags());
        // Any new type handler we expect to see here should have inline slot capacity locked.  If this were to change, we would need
        // to update our shrinking logic (see PathTypeHandlerBase::ShrinkSlotAndInlineSlotCapacity).
        Assert(newTypeHandler->GetIsInlineSlotCapacityLocked());
        newTypeHandler->SetPropertyTypes(PropertyTypesWritableDataOnly | PropertyTypesWritableDataOnlyDetection | PropertyTypesHasSpecialProperties, this->GetPropertyTypes());
        newTypeHandler->SetInstanceTypeHandler(instance);
#if ENABLE_FIXED_FIELDS
        // We assumed that we don't need to transfer used as fixed bits unless we are a prototype, which is only valid if we also changed the type.
        Assert(transferUsedAsFixed || (instance->GetType() != oldType && oldType->GetTypeId() != TypeIds_GlobalObject));
        Assert(!newTypeHandler->HasSingletonInstance() || !instance->HasSharedType());

#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
        TraceFixedFieldsAfterTypeHandlerChange(instance, this, newTypeHandler, oldType, oldSingletonInstance);
#endif
#endif
        return newTypeHandler;
    }